

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void * __thiscall nuraft::buffer_serializer::get_bytes(buffer_serializer *this,size_t *len)

{
  bool bVar1;
  uint32_t uVar2;
  overflow_error *this_00;
  void *pvVar3;
  ulong *in_RSI;
  buffer_serializer *in_RDI;
  buffer_serializer *unaff_retaddr;
  size_t in_stack_ffffffffffffffd0;
  buffer_serializer *in_stack_ffffffffffffffe0;
  
  uVar2 = get_u32(unaff_retaddr);
  *in_RSI = (ulong)uVar2;
  bVar1 = is_valid(in_RDI,in_stack_ffffffffffffffd0);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pvVar3 = get_raw(in_stack_ffffffffffffffe0,(size_t)in_RDI);
  return pvVar3;
}

Assistant:

void* buffer_serializer::get_bytes(size_t& len) {
    len = get_u32();
    if ( !is_valid(len) ) throw std::overflow_error("not enough space");
    return get_raw(len);
}